

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_points.h
# Opt level: O3

PrimInfo * __thiscall
embree::avx512::PointsISA::createPrimRefArrayMB
          (PrimInfo *__return_storage_ptr__,PointsISA *this,PrimRef *prims,BBox1f *time_range,
          range<unsigned_long> *r,size_t k,uint geomID)

{
  float fVar1;
  BBox1f BVar2;
  ulong uVar3;
  BufferView<embree::Vec3fx> *pBVar4;
  bool bVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  ulong uVar8;
  uint uVar9;
  char *extraout_RDX;
  char *pcVar10;
  ulong uVar11;
  size_t *in_R11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar17;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar18;
  undefined1 auVar19 [64];
  float fVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  float fVar23;
  undefined1 auVar24 [16];
  undefined1 local_38 [8];
  undefined1 extraout_var [56];
  
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0.
  m128[0] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0.
  m128[1] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0.
  m128[2] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0.
  m128[3] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0.
  m128[0] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0.
  m128[1] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0.
  m128[2] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0.
  m128[3] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0.
  m128[0] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0.
  m128[1] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0.
  m128[2] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0.
  m128[3] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0.
  m128[0] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0.
  m128[1] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0.
  m128[2] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0.
  m128[3] = -INFINITY;
  __return_storage_ptr__->begin = SUB168(ZEXT816(0) << 0x20,0);
  __return_storage_ptr__->end = SUB168(ZEXT816(0) << 0x20,8);
  auVar19._0_8_ = Geometry::getTimeRange((Geometry *)this);
  auVar19._8_56_ = extraout_var;
  auVar21._8_8_ = 0;
  auVar21._0_4_ = time_range->lower;
  auVar21._4_4_ = time_range->upper;
  auVar16 = auVar19._0_16_;
  uVar8 = vcmpps_avx512vl(auVar16,auVar21,1);
  auVar15 = vblendps_avx(auVar21,auVar16,2);
  auVar16 = vinsertps_avx(auVar16,auVar21,0x50);
  bVar5 = (bool)((byte)uVar8 & 1);
  auVar12._0_4_ = (float)((uint)bVar5 * auVar15._0_4_ | (uint)!bVar5 * auVar16._0_4_);
  bVar5 = (bool)((byte)(uVar8 >> 1) & 1);
  auVar12._4_4_ = (uint)bVar5 * auVar15._4_4_ | (uint)!bVar5 * auVar16._4_4_;
  bVar5 = (bool)((byte)(uVar8 >> 2) & 1);
  auVar12._8_4_ = (uint)bVar5 * auVar15._8_4_ | (uint)!bVar5 * auVar16._8_4_;
  bVar5 = (bool)((byte)(uVar8 >> 3) & 1);
  auVar12._12_4_ = (uint)bVar5 * auVar15._12_4_ | (uint)!bVar5 * auVar16._12_4_;
  auVar15 = vmovshdup_avx(auVar12);
  fVar20 = auVar15._0_4_;
  if (auVar12._0_4_ <= fVar20) {
    uVar8 = r->_begin;
    uVar3 = r->_end;
    if (uVar8 < uVar3) {
      aVar17.m128[2] = -INFINITY;
      aVar17._0_8_ = 0xff800000ff800000;
      aVar17.m128[3] = -INFINITY;
      aVar18.m128[2] = INFINITY;
      aVar18._0_8_ = 0x7f8000007f800000;
      aVar18.m128[3] = INFINITY;
      auVar15._8_4_ = 0xddccb9a2;
      auVar15._0_8_ = 0xddccb9a2ddccb9a2;
      auVar15._12_4_ = 0xddccb9a2;
      auVar16._8_4_ = 0x5dccb9a2;
      auVar16._0_8_ = 0x5dccb9a25dccb9a2;
      auVar16._12_4_ = 0x5dccb9a2;
      pcVar10 = extraout_RDX;
      do {
        BVar2 = (this->super_Points).super_Geometry.time_range;
        auVar24._8_8_ = 0;
        auVar24._0_4_ = BVar2.lower;
        auVar24._4_4_ = BVar2.upper;
        auVar21 = vmovshdup_avx(auVar24);
        auVar13 = vsubss_avx512f(auVar21,auVar24);
        fVar23 = BVar2.lower;
        auVar14 = vdivss_avx512f(ZEXT416((uint)(fVar20 - fVar23)),auVar13);
        pBVar4 = (this->super_Points).vertices.items;
        if ((uVar8 & 0xffffffff) < (pBVar4->super_RawBufferView).num) {
          fVar1 = (this->super_Points).super_Geometry.fnumTimeSegments;
          auVar14 = ZEXT416((uint)(fVar1 * auVar14._0_4_ * 0.99999976));
          auVar14 = vroundss_avx(auVar14,auVar14,10);
          auVar22 = ZEXT416((uint)fVar1);
          auVar14 = vminss_avx(auVar14,auVar22);
          auVar13 = vdivss_avx512f(ZEXT416((uint)(auVar12._0_4_ - fVar23)),auVar13);
          auVar13 = vmulss_avx512f(auVar13,SUB6416(ZEXT464(0x3f800002),0));
          auVar13 = vmulss_avx512f(auVar22,auVar13);
          auVar13 = vrndscaless_avx512f(auVar13,auVar13);
          *(uint *)(pcVar10 + -0x5f) = *(uint *)(pcVar10 + -0x5f) | (uint)local_38;
          *(byte *)(uVar3 - 0x40) = *(byte *)(uVar3 - 0x40) | (byte)in_R11;
          uVar9 = vcvttss2si_avx512f(auVar13);
          pcVar10 = (char *)CONCAT44((int)((ulong)pcVar10 >> 0x20),uVar9);
          if ((uint)(int)auVar14._0_4_ < uVar9) {
LAB_01f12cbb:
            auVar15 = vsubss_avx512f(auVar21,auVar24);
            auVar16 = vdivss_avx512f(ZEXT416((uint)(auVar12._0_4_ - fVar23)),auVar15);
            auVar15 = vdivss_avx512f(ZEXT416((uint)(fVar20 - fVar23)),auVar15);
            auVar16 = vmulss_avx512f(auVar22,auVar16);
            vmulss_avx512f(auVar22,auVar15);
            vrndscaless_avx512f(auVar16,auVar16);
            *(uint *)(pcVar10 + 0x33) = *(uint *)(pcVar10 + 0x33) | (uint)local_38;
            *pcVar10 = *pcVar10 + (char)uVar8;
            halt_baddata();
          }
          uVar11 = (ulong)(int)uVar9;
          in_R11 = &pBVar4[uVar11].super_RawBufferView.stride;
          while( true ) {
            pcVar10 = (char *)(*in_R11 * (uVar8 & 0xffffffff));
            uVar6 = vcmpps_avx512vl(*(undefined1 (*) [16])
                                     (pcVar10 + (long)((RawBufferView *)(in_R11 + -2))->ptr_ofs),
                                    auVar15,6);
            uVar7 = vcmpps_avx512vl(*(undefined1 (*) [16])
                                     (pcVar10 + (long)((RawBufferView *)(in_R11 + -2))->ptr_ofs),
                                    auVar16,1);
            if (((byte)((byte)uVar6 & (byte)uVar7) != 0xf) ||
               (*(float *)(pcVar10 + (long)(((RawBufferView *)(in_R11 + -2))->ptr_ofs + 0xc)) < 0.0)
               ) break;
            uVar11 = uVar11 + 1;
            in_R11 = in_R11 + 7;
            if ((ulong)(long)(int)auVar14._0_4_ < uVar11) goto LAB_01f12cbb;
          }
        }
        uVar8 = uVar8 + 1;
      } while (uVar8 < uVar3);
    }
    else {
      aVar17 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vbroadcastss_avx512vl(ZEXT416(0xff800000));
      aVar18 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vbroadcastss_avx512vl(ZEXT416(0x7f800000));
    }
    (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0
         = aVar18;
    (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0
         = aVar17;
    (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0
         = aVar18;
    (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0
         = aVar17;
    __return_storage_ptr__->end = 0;
  }
  return __return_storage_ptr__;
}

Assistant:

PrimInfo createPrimRefArrayMB(PrimRef* prims, const BBox1f& time_range, const range<size_t>& r, size_t k, unsigned int geomID) const
      {
        PrimInfo pinfo(empty);
        const BBox1f t0t1 = BBox1f::intersect(getTimeRange(), time_range);
        if (t0t1.empty()) return pinfo;
        
        for (size_t j = r.begin(); j < r.end(); j++) {
          LBBox3fa lbounds = empty;
          if (!linearBounds(j, t0t1, lbounds))
            continue;
          const PrimRef prim(lbounds.bounds(), geomID, unsigned(j));
          pinfo.add_center2(prim);
          prims[k++] = prim;
        }
        return pinfo;
      }